

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SCASerialization.h
# Opt level: O1

void __thiscall
Js::SerializationCloner<Js::StreamWriter>::WriteTypedArray<unsigned_char,false,true>
          (SerializationCloner<Js::StreamWriter> *this,Src src)

{
  TypedArray<unsigned_char,_false,_true> *pTVar1;
  Engine *this_00;
  uint local_24 [2];
  uint unused;
  
  StreamWriter::Write<unsigned_int>(this->m_writer,local_24);
  pTVar1 = VarTo<Js::TypedArray<unsigned_char,false,true>>(src);
  this_00 = ClonerBase<void_*,_unsigned_int,_Js::TypeId,_Js::SerializationCloner<Js::StreamWriter>_>
            ::GetEngine(&this->
                         super_ClonerBase<void_*,_unsigned_int,_Js::TypeId,_Js::SerializationCloner<Js::StreamWriter>_>
                       );
  SCAEngine<void_*,_unsigned_int,_Js::SerializationCloner<Js::StreamWriter>_>::Clone
            (this_00,(pTVar1->super_TypedArrayBase).super_ArrayBufferParent.arrayBuffer.ptr,local_24
            );
  StreamWriter::Write<unsigned_int>(this->m_writer,local_24);
  StreamWriter::Write<unsigned_int>(this->m_writer,local_24);
  return;
}

Assistant:

void WriteTypedArray(Src src) const
        {
            typedef TypedArrayTrace<T, clamped, isVirtual> trace_type;
            typedef typename trace_type::TypedArrayType array_type;

            WriteTypeId(trace_type::GetSCATypeId());
            array_type* arr = VarTo<array_type>(src);

            this->GetEngine()->Clone(arr->GetArrayBuffer());

            Write(arr->GetByteOffset());
            Write(arr->GetLength());
        }